

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void sqlcheck::CheckJoinCount(Configuration *state,string *sql_statement,bool *print_statement)

{
  string title;
  string local_90;
  string local_70;
  regex pattern;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(\bjoin\b)",0x10);
  title._M_dataplus._M_p = (pointer)&title.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&title,"Reduce Number of JOINs","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,title._M_dataplus._M_p,
             title._M_dataplus._M_p + title._M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,anon_var_dwarf_d06d5,anon_var_dwarf_d06d5 + 0xb8);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,
               &local_90,&local_70,true,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)title._M_dataplus._M_p != &title.field_2) {
    operator_delete(title._M_dataplus._M_p);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckJoinCount(Configuration& state,
                    const std::string& sql_statement,
                    bool& print_statement){

  std::regex pattern("(\bjoin\b)");
  std::string title = "Reduce Number of JOINs";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;
  std::size_t min_count = 5;

  auto message =
      "● Reduce Number of JOINs:  "
      "Too many JOINs is a symptom of complex spaghetti queries. Consider splitting "
      "up the complex query into many simpler queries, and reduce the number of JOINs";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true,
               min_count);

}